

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O0

bool Assimp::IFC::TryQueryMeshCache
               (IfcRepresentationItem *item,
               set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *mesh_indices,uint mat_index,ConversionData *conv)

{
  bool bVar1;
  reference ppVar2;
  iterator __first;
  iterator __last;
  iterator __i;
  insert_iterator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  __result;
  iterator local_60;
  _Rb_tree_const_iterator<std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  local_58;
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  local_48;
  const_iterator it;
  MeshCacheIndex idx;
  ConversionData *conv_local;
  uint mat_index_local;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *mesh_indices_local;
  IfcRepresentationItem *item_local;
  
  ConversionData::MeshCacheIndex::MeshCacheIndex((MeshCacheIndex *)&it,item,mat_index);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<Assimp::IFC::ConversionData::MeshCacheIndex>,_std::allocator<std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
       ::find(&conv->cached_meshes,(key_type *)&it);
  std::
  _Rb_tree_const_iterator<std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::_Rb_tree_const_iterator(&local_48,&local_50);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<Assimp::IFC::ConversionData::MeshCacheIndex>,_std::allocator<std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
       ::end(&conv->cached_meshes);
  std::
  _Rb_tree_const_iterator<std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::_Rb_tree_const_iterator(&local_58,&local_60);
  bVar1 = std::operator!=(&local_48,&local_58);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             ::operator*(&local_48);
    __first = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                        (&ppVar2->second);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             ::operator*(&local_48);
    __last = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                       (&ppVar2->second);
    __i = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                    (mesh_indices);
    __result = std::
               inserter<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
                         (mesh_indices,__i);
    std::
    copy<std::_Rb_tree_const_iterator<unsigned_int>,std::insert_iterator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>
              ((_Rb_tree_const_iterator<unsigned_int>)__first._M_node,
               (_Rb_tree_const_iterator<unsigned_int>)__last._M_node,__result);
  }
  return bVar1;
}

Assistant:

bool TryQueryMeshCache(const Schema_2x3::IfcRepresentationItem& item,
    std::set<unsigned int>& mesh_indices, unsigned int mat_index,
    ConversionData& conv)
{
    ConversionData::MeshCacheIndex idx(&item, mat_index);
    ConversionData::MeshCache::const_iterator it = conv.cached_meshes.find(idx);
    if (it != conv.cached_meshes.end()) {
        std::copy((*it).second.begin(),(*it).second.end(),std::inserter(mesh_indices, mesh_indices.end()));
        return true;
    }
    return false;
}